

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int cmsys::SystemTools::Strucmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  
  cVar4 = *s1;
  if (cVar4 == '\0') {
    iVar1 = 0;
  }
  else {
    pcVar3 = s1 + 1;
    do {
      iVar1 = tolower((int)cVar4);
      iVar2 = tolower((int)*s2);
      if (iVar1 != iVar2) goto LAB_0010d084;
      s2 = s2 + 1;
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
    cVar4 = '\0';
LAB_0010d084:
    iVar1 = (int)cVar4;
  }
  iVar1 = tolower(iVar1);
  iVar2 = tolower((int)*s2);
  return iVar1 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char *s1, const char *s2)
{
  // lifted from Graphvis http://www.graphviz.org
  while ((*s1 != '\0')
         && (tolower(*s1) == tolower(*s2)))
    {
      s1++;
      s2++;
    }

  return tolower(*s1) - tolower(*s2);
}